

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O0

bool __thiscall
storage::BTLeafNode::search_record(BTLeafNode *this,int key,Record **out_record,int *out_index)

{
  int iVar1;
  int local_38;
  int M;
  int R;
  int L;
  int *out_index_local;
  Record **out_record_local;
  int key_local;
  BTLeafNode *this_local;
  
  M = 0;
  local_38 = (this->super_BTNode).used_links_count_ + -2;
  while( true ) {
    if (local_38 < M) {
      return false;
    }
    iVar1 = M + (local_38 - M >> 1);
    if ((this->super_BTNode).keys_[iVar1] == key) break;
    if (key < (this->super_BTNode).keys_[iVar1]) {
      local_38 = iVar1 + -1;
    }
    else {
      M = iVar1 + 1;
    }
  }
  *out_record = this->record_links_[iVar1];
  *out_index = iVar1;
  return true;
}

Assistant:

bool BTLeafNode::search_record(int key, Record *&out_record, int &out_index) {
        int L = 0, R = used_links_count_ - 2;
        while (L <= R) {
            int M = L + ((R - L) >> 1);
            if (keys_[M] == key) {
                out_record = record_links_[M];
                out_index = M;
                return true;
            } else if (keys_[M] > key) {
                R = M - 1;
            } else {
                L = M + 1;
            }
        }
        return false;
    }